

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::cast_to_variable_store
          (CompilerMSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRExpression *pSVar3;
  SPIRVariable *var_00;
  bool bVar4;
  undefined1 local_700 [40];
  SPIRType type_1;
  spirv_cross local_560 [32];
  undefined1 local_540 [8];
  SPIRType type;
  BaseType local_3d8;
  uint32_t expected_width;
  BaseType expected_type;
  ID local_3cc;
  BuiltIn builtin;
  spirv_cross local_3a8 [32];
  undefined1 local_388 [8];
  SPIRType matrix_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  spirv_cross local_1f8 [32];
  undefined1 local_1d8 [8];
  SPIRType short_type;
  bool rewrite_boolean_store;
  SPIRType *pSStack_50;
  uint32_t phys_id;
  SPIRType *phys_type;
  SPIRType *var_type;
  SPIRVariable *var;
  SPIRExpression *target_expr;
  bool is_packed;
  SPIRType *expr_type_local;
  string *expr_local;
  uint32_t target_id_local;
  CompilerMSL *this_local;
  
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this,target_id,SPIRVCrossDecorationPhysicalTypePacked);
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,target_id);
  var_00 = Compiler::maybe_get_backing_variable((Compiler *)this,target_id);
  phys_type = (SPIRType *)0x0;
  uVar2 = Compiler::get_extended_decoration
                    ((Compiler *)this,target_id,SPIRVCrossDecorationPhysicalTypeID);
  pSStack_50 = expr_type;
  if (uVar2 != 0) {
    pSStack_50 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  }
  expr_local._4_4_ = target_id;
  if (var_00 != (SPIRVariable *)0x0) {
    expr_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_00->super_IVariant).self);
    phys_type = Compiler::get_variable_data_type((Compiler *)this,var_00);
  }
  bVar4 = false;
  if (((expr_type->basetype == Boolean) && (bVar4 = false, var_00 != (SPIRVariable *)0x0)) &&
     (bVar4 = true, var_00->storage != StorageClassWorkgroup)) {
    bVar4 = phys_type->basetype == Struct;
  }
  if (bVar4) {
    bVar4 = Compiler::is_array((Compiler *)this,expr_type);
    if (bVar4) {
      CompilerGLSL::to_rerolled_array_expression
                ((CompilerGLSL *)&short_type.member_name_cache._M_h._M_single_bucket,
                 (SPIRType *)this,(string *)phys_type,(SPIRType *)expr);
      ::std::__cxx11::string::operator=
                ((string *)expr,(string *)&short_type.member_name_cache._M_h._M_single_bucket);
      ::std::__cxx11::string::~string((string *)&short_type.member_name_cache._M_h._M_single_bucket)
      ;
    }
    else {
      SPIRType::SPIRType((SPIRType *)local_1d8,expr_type);
      short_type.super_IVariant.self.id = 5;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_218,this,(SPIRType *)local_1d8,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (local_1f8,local_218,(char (*) [2])0x422b6e,expr,(char (*) [2])0x40bd22);
      ::std::__cxx11::string::operator=((string *)expr,(string *)local_1f8);
      ::std::__cxx11::string::~string((string *)local_1f8);
      ::std::__cxx11::string::~string((string *)local_218);
      SPIRType::~SPIRType((SPIRType *)local_1d8);
    }
  }
  bVar4 = Options::supports_msl_version(&this->msl_options,3,0,0);
  if ((!bVar4) && (var_00 != (SPIRVariable *)0x0)) {
    if (var_00->storage == StorageClassWorkgroup) {
LAB_0030a3a2:
      if (1 < expr_type->columns) {
        SPIRType::SPIRType((SPIRType *)local_388,pSStack_50);
        if ((pSVar3 != (SPIRExpression *)0x0) && ((pSVar3->need_transpose & 1U) != 0)) {
          ::std::swap<unsigned_int>(&matrix_type.basetype,&matrix_type.width);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&builtin,this,local_388,0)
        ;
        join<char_const(&)[12],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (local_3a8,(char (*) [12])"spvStorage_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin,
                   (char (*) [2])0x422b6e,expr,(char (*) [2])0x40bd22);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_3a8);
        ::std::__cxx11::string::~string((string *)local_3a8);
        ::std::__cxx11::string::~string((string *)&builtin);
        SPIRType::~SPIRType((SPIRType *)local_388);
      }
    }
    else if (phys_type->basetype == Struct) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(phys_type->super_IVariant).self);
      bVar4 = Compiler::has_extended_decoration
                        ((Compiler *)this,uVar2,SPIRVCrossDecorationWorkgroupStruct);
      if ((bVar4) && (!bVar1)) goto LAB_0030a3a2;
    }
  }
  TypedID<(spirv_cross::Types)0>::TypedID(&local_3cc,expr_local._4_4_);
  bVar1 = Compiler::has_decoration((Compiler *)this,local_3cc,DecorationBuiltIn);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return;
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&expected_width,expr_local._4_4_);
  expected_type = Compiler::get_decoration((Compiler *)this,(ID)expected_width,DecorationBuiltIn);
  local_3d8 = expr_type->basetype;
  type.member_name_cache._M_h._M_single_bucket._4_4_ = expr_type->width;
  if ((expected_type != Int) && (1 < expected_type - Int64)) {
    if (expected_type - AtomicCounter < 2) {
      local_3d8 = Half;
      type.member_name_cache._M_h._M_single_bucket._4_4_ = 0x10;
      goto LAB_0030a5b0;
    }
    if ((expected_type != 0x1158) && (expected_type != 0x1396)) goto LAB_0030a5b0;
  }
  local_3d8 = UInt;
  type.member_name_cache._M_h._M_single_bucket._4_4_ = 0x20;
LAB_0030a5b0:
  if (local_3d8 != expr_type->basetype) {
    if (type.member_name_cache._M_h._M_single_bucket._4_4_ == expr_type->width) {
      SPIRType::SPIRType((SPIRType *)(local_700 + 0x20),expr_type);
      type_1.super_IVariant.self.id = local_3d8;
      CompilerGLSL::bitcast_expression
                ((CompilerGLSL *)local_700,(SPIRType *)this,(BaseType)(SPIRType *)(local_700 + 0x20)
                 ,(string *)(ulong)expr_type->basetype);
      ::std::__cxx11::string::operator=((string *)expr,(string *)local_700);
      ::std::__cxx11::string::~string((string *)local_700);
      SPIRType::~SPIRType((SPIRType *)(local_700 + 0x20));
    }
    else {
      SPIRType::SPIRType((SPIRType *)local_540,expr_type);
      type.super_IVariant.self.id = local_3d8;
      type.super_IVariant._12_4_ = type.member_name_cache._M_h._M_single_bucket._4_4_;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&type_1.member_name_cache._M_h._M_single_bucket,this,(SPIRType *)local_540,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (local_560,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &type_1.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x422b6e,expr,
                 (char (*) [2])0x40bd22);
      ::std::__cxx11::string::operator=((string *)expr,(string *)local_560);
      ::std::__cxx11::string::~string((string *)local_560);
      ::std::__cxx11::string::~string((string *)&type_1.member_name_cache._M_h._M_single_bucket);
      SPIRType::~SPIRType((SPIRType *)local_540);
    }
  }
  return;
}

Assistant:

void CompilerMSL::cast_to_variable_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	bool is_packed = has_extended_decoration(target_id, SPIRVCrossDecorationPhysicalTypePacked);
	auto *target_expr = maybe_get<SPIRExpression>(target_id);
	auto *var = maybe_get_backing_variable(target_id);
	const SPIRType *var_type = nullptr, *phys_type = nullptr;

	if (uint32_t phys_id = get_extended_decoration(target_id, SPIRVCrossDecorationPhysicalTypeID))
		phys_type = &get<SPIRType>(phys_id);
	else
		phys_type = &expr_type;

	if (var)
	{
		target_id = var->self;
		var_type = &get_variable_data_type(*var);
	}

	bool rewrite_boolean_store =
		expr_type.basetype == SPIRType::Boolean &&
		(var && (var->storage == StorageClassWorkgroup || var_type->basetype == SPIRType::Struct));

	// Type fixups for workgroup variables or struct members if they are booleans.
	if (rewrite_boolean_store)
	{
		if (is_array(expr_type))
		{
			expr = to_rerolled_array_expression(*var_type, expr, expr_type);
		}
		else
		{
			auto short_type = expr_type;
			short_type.basetype = SPIRType::Short;
			expr = join(type_to_glsl(short_type), "(", expr, ")");
		}
	}

	// Type fixups for workgroup variables if they are matrices.
	// Don't do fixup for packed types; those are handled specially.
	// FIXME: Maybe use a type like spvStorageMatrix for packed matrices?
	if (!msl_options.supports_msl_version(3, 0) && var &&
	    (var->storage == StorageClassWorkgroup ||
	     (var_type->basetype == SPIRType::Struct &&
	      has_extended_decoration(var_type->self, SPIRVCrossDecorationWorkgroupStruct) && !is_packed)) &&
	    expr_type.columns > 1)
	{
		SPIRType matrix_type = *phys_type;
		if (target_expr && target_expr->need_transpose)
			swap(matrix_type.vecsize, matrix_type.columns);
		expr = join("spvStorage_", type_to_glsl(matrix_type), "(", expr, ")");
	}

	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;
	auto expected_width = expr_type.width;
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInPrimitiveId:
	case BuiltInViewIndex:
		expected_type = SPIRType::UInt;
		expected_width = 32;
		break;

	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		expected_type = SPIRType::Half;
		expected_width = 16;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
	{
		if (expected_width != expr_type.width)
		{
			// These are of different widths, so we cannot do a straight bitcast.
			auto type = expr_type;
			type.basetype = expected_type;
			type.width = expected_width;
			expr = join(type_to_glsl(type), "(", expr, ")");
		}
		else
		{
			auto type = expr_type;
			type.basetype = expected_type;
			expr = bitcast_expression(type, expr_type.basetype, expr);
		}
	}
}